

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso.c
# Opt level: O2

void Gia_IsoTest(Gia_Man_t *p,Abc_Cex_t *pCex,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *vPiPerm;
  Gia_Man_t *pTwo;
  Gia_Man_t *pInit;
  Gia_Man_t *p_00;
  Vec_Int_t *vPermOld;
  Vec_Int_t *vPermNew;
  Abc_Cex_t *p_01;
  char *pcVar3;
  int iVar4;
  Vec_Ptr_t *vPisPerm;
  Vec_Ptr_t *vPosEquivs;
  
  iVar4 = p->nRegs;
  if (p->vCos->nSize - iVar4 != 1) {
    __assert_fail("Gia_ManPoNum(p) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                  ,0x507,"void Gia_IsoTest(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  if (0 < iVar4) {
    vPiPerm = Gia_IsoTestGenPerm(p->vCis->nSize - iVar4);
    puts("Considering random permutation of the primary inputs of the AIG:");
    uVar1 = vPiPerm->nSize;
    printf("Vector has %d entries: {",(ulong)uVar1);
    for (iVar4 = 0; iVar4 < (int)uVar1; iVar4 = iVar4 + 1) {
      uVar2 = Vec_IntEntry(vPiPerm,iVar4);
      printf(" %d",(ulong)uVar2);
    }
    puts(" }");
    pTwo = Gia_ManDupPerm(p,vPiPerm);
    pInit = Gia_ManDupAppendNew(p,pTwo);
    p_00 = Gia_ManIsoReduce(pInit,&vPosEquivs,&vPisPerm,0,0,0,0);
    Vec_VecFree((Vec_Vec_t *)vPosEquivs);
    vPermOld = (Vec_Int_t *)Vec_PtrEntry(vPisPerm,0);
    vPermNew = (Vec_Int_t *)Vec_PtrEntry(vPisPerm,1);
    p_01 = Abc_CexPermuteTwo(pCex,vPermOld,vPermNew);
    Vec_VecFree((Vec_Vec_t *)vPisPerm);
    iVar4 = Gia_ManVerifyCex(p,pCex,0);
    pcVar3 = "CEX for the init AIG is valid.";
    if (iVar4 == 0) {
      pcVar3 = "CEX for the init AIG is not valid.";
    }
    puts(pcVar3);
    iVar4 = Gia_ManVerifyCex(pTwo,p_01,0);
    pcVar3 = "CEX for the perm AIG is valid.";
    if (iVar4 == 0) {
      pcVar3 = "CEX for the perm AIG is not valid.";
    }
    puts(pcVar3);
    Gia_ManStop(p_00);
    Gia_ManStop(pInit);
    Gia_ManStop(pTwo);
    Vec_IntFree(vPiPerm);
    Abc_CexFree(p_01);
    return;
  }
  __assert_fail("Gia_ManRegNum(p) > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso.c"
                ,0x508,"void Gia_IsoTest(Gia_Man_t *, Abc_Cex_t *, int)");
}

Assistant:

void Gia_IsoTest( Gia_Man_t * p, Abc_Cex_t * pCex, int fVerbose )
{
    Abc_Cex_t * pCexNew;
    Vec_Int_t * vPiPerm;
    Vec_Ptr_t * vPosEquivs, * vPisPerm;
    Vec_Int_t * vPerm0, * vPerm1;
    Gia_Man_t * pPerm, * pDouble, * pAig;
    assert( Gia_ManPoNum(p) == 1 );
    assert( Gia_ManRegNum(p) > 0 );
    // generate random permutation of PIs
    vPiPerm = Gia_IsoTestGenPerm( Gia_ManPiNum(p) );
    printf( "Considering random permutation of the primary inputs of the AIG:\n" );
    Vec_IntPrint( vPiPerm );
    // create AIG with two primary outputs (original and permuted)
    pPerm = Gia_ManDupPerm( p, vPiPerm );
    pDouble = Gia_ManDupAppendNew( p, pPerm );
//Gia_AigerWrite( pDouble, "test.aig", 0, 0 );

    // analyze the two-output miter
    pAig = Gia_ManIsoReduce( pDouble, &vPosEquivs, &vPisPerm, 0, 0, 0, 0 );
    Vec_VecFree( (Vec_Vec_t *)vPosEquivs );

    // given CEX for output 0, derive CEX for output 1
    vPerm0 = (Vec_Int_t *)Vec_PtrEntry( vPisPerm, 0 );
    vPerm1 = (Vec_Int_t *)Vec_PtrEntry( vPisPerm, 1 );
    pCexNew = Abc_CexPermuteTwo( pCex, vPerm0, vPerm1 );
    Vec_VecFree( (Vec_Vec_t *)vPisPerm );

    // check that original CEX and the resulting CEX is valid
    if ( Gia_ManVerifyCex(p, pCex, 0) )
        printf( "CEX for the init AIG is valid.\n" );
    else
        printf( "CEX for the init AIG is not valid.\n" );
    if ( Gia_ManVerifyCex(pPerm, pCexNew, 0) )
        printf( "CEX for the perm AIG is valid.\n" );
    else
        printf( "CEX for the perm AIG is not valid.\n" );
    // delete
    Gia_ManStop( pAig );
    Gia_ManStop( pDouble );
    Gia_ManStop( pPerm );
    Vec_IntFree( vPiPerm );
    Abc_CexFree( pCexNew );
}